

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

bool __thiscall
GmmLib::GmmResourceInfoCommon::IsMipRCCAligned(GmmResourceInfoCommon *this,uint8_t *MisAlignedLod)

{
  uint uVar1;
  byte local_23;
  uint8_t lod;
  uint8_t RCCCachelineHeight;
  uint8_t RCCCachelineWidth;
  uint8_t *MisAlignedLod_local;
  GmmResourceInfoCommon *this_local;
  
  local_23 = 0;
  while( true ) {
    uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x2a])();
    if ((uVar1 & 0xff) < (uint)local_23) {
      return true;
    }
    uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x16])(this,(ulong)local_23);
    if (((uVar1 & 0x1f) != 0) ||
       (uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x17])(this,(ulong)local_23), (uVar1 & 3) != 0))
    break;
    local_23 = local_23 + 1;
  }
  *MisAlignedLod = local_23;
  return false;
}

Assistant:

bool GMM_STDCALL GmmLib::GmmResourceInfoCommon::IsMipRCCAligned(uint8_t &MisAlignedLod)
{
    const uint8_t RCCCachelineWidth  = 32;
    const uint8_t RCCCachelineHeight = 4;

    for(uint8_t lod = 0; lod <= ((uint8_t)GetMaxLod()); lod++)
    {
        if(!(GFX_IS_ALIGNED(GetMipWidth(lod), RCCCachelineWidth) &&
             GFX_IS_ALIGNED(GetMipHeight(lod), RCCCachelineHeight)))
        {
            MisAlignedLod = lod;
            return false;
        }
    }
    return true;
}